

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReshapeLayerParams::InternalSwap
          (ReshapeLayerParams *this,ReshapeLayerParams *other)

{
  ReshapeLayerParams *other_local;
  ReshapeLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->targetshape_,&other->targetshape_);
  std::swap<int>(&this->mode_,&other->mode_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ReshapeLayerParams::InternalSwap(ReshapeLayerParams* other) {
  targetshape_.InternalSwap(&other->targetshape_);
  std::swap(mode_, other->mode_);
  std::swap(_cached_size_, other->_cached_size_);
}